

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

target_long_conflict decode_sleb128(uint8_t **pp)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  
  pbVar4 = *pp;
  uVar2 = 0;
  uVar3 = 0xfffffff9;
  do {
    uVar3 = uVar3 + 7;
    bVar1 = *pbVar4;
    pbVar4 = pbVar4 + 1;
    uVar2 = uVar2 | (bVar1 & 0x7f) << ((byte)uVar3 & 0x1f);
  } while ((char)bVar1 < '\0');
  uVar5 = -0x80 << ((byte)uVar3 & 0x1f);
  if (bVar1 < 0x40) {
    uVar5 = 0;
  }
  if (0x18 < uVar3) {
    uVar5 = 0;
  }
  *pp = pbVar4;
  return uVar2 | uVar5;
}

Assistant:

static target_long decode_sleb128(uint8_t **pp)
{
    uint8_t *p = *pp;
    target_long val = 0;
    int byte, shift = 0;

    do {
        byte = *p++;
        val |= (target_ulong)(byte & 0x7f) << shift;
        shift += 7;
    } while (byte & 0x80);
    if (shift < TARGET_LONG_BITS && (byte & 0x40)) {
#ifdef _MSC_VER
        val |= ((target_ulong)0 - 1) << shift;
#else
        val |= -(target_ulong)1 << shift;
#endif
    }

    *pp = p;
    return val;
}